

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  Flow_Data_t *pFVar2;
  Abc_NtkFunc_t AVar3;
  int iVar4;
  undefined4 uVar5;
  void **__ptr;
  long *plVar6;
  long *plVar7;
  long lVar8;
  Abc_Obj_t *pAVar9;
  long lVar10;
  void *pvVar11;
  bool bVar12;
  MinRegMan_t *pMVar13;
  uint uVar14;
  Vec_Ptr_t *pVVar15;
  int *piVar16;
  Vec_Ptr_t *pVVar17;
  uint uVar18;
  uint uVar19;
  Abc_Ntk_t *extraout_RDX;
  Abc_Ntk_t *extraout_RDX_00;
  Abc_Ntk_t *extraout_RDX_01;
  Abc_Ntk_t *extraout_RDX_02;
  Abc_Ntk_t *extraout_RDX_03;
  Abc_Ntk_t *extraout_RDX_04;
  Abc_Ntk_t *extraout_RDX_05;
  Abc_Ntk_t *extraout_RDX_06;
  Abc_Ntk_t *pAVar20;
  Abc_Ntk_t *extraout_RDX_07;
  Vec_Ptr_t *extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong uVar21;
  ulong extraout_RDX_14;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  
  pMVar13 = pManMR;
  pManMR->nExactConstraints = 0;
  pAVar20 = (Abc_Ntk_t *)pMVar13->vExactNodes;
  AVar3 = pAVar20->ntkFunc;
  while (AVar3 != ABC_FUNC_NONE) {
    if ((int)AVar3 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    pAVar20->ntkFunc = AVar3 - ABC_FUNC_SOP;
    uVar14 = *(uint *)((long)*(void **)((long)pAVar20->pName + (ulong)(AVar3 - ABC_FUNC_SOP) * 8) +
                      0x10);
    if (pMVar13->vTimeEdges[uVar14].nSize != 0) {
      pVVar15 = pMVar13->vTimeEdges + uVar14;
      __ptr = pVVar15->pArray;
      pVVar15->nCap = 0;
      pVVar15->nSize = 0;
      pVVar15->pArray = (void **)0x0;
      if (__ptr != (void **)0x0) {
        free(__ptr);
      }
    }
    pAVar20 = (Abc_Ntk_t *)pManMR->vExactNodes;
    pMVar13 = pManMR;
    AVar3 = pAVar20->ntkFunc;
  }
  pVVar15 = pMVar13->vNodes;
  if (pMVar13->fIsForward == 0) {
    if (pVVar15->nSize != 0) {
      __assert_fail("!Vec_PtrSize(vNodes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                    ,0x105,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
    }
    pMVar13->nConservConstraints = 0;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar4 = pNtk->vObjs->nSize;
      uVar25 = (long)iVar4 + 500;
      iVar22 = (int)uVar25;
      if ((pNtk->vTravIds).nCap < iVar22) {
        piVar16 = (int *)malloc(uVar25 * 4);
        (pNtk->vTravIds).pArray = piVar16;
        if (piVar16 == (int *)0x0) goto LAB_004e4170;
        (pNtk->vTravIds).nCap = iVar22;
      }
      else {
        piVar16 = (int *)0x0;
      }
      if (-500 < iVar4) {
        memset(piVar16,0,(uVar25 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar22;
    }
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (iVar4 < 0x3fffffff) {
      pVVar17 = pNtk->vPos;
      if (pVVar17->nSize < 1) {
        uVar25 = 0;
      }
      else {
        lVar23 = 0;
        do {
          Abc_FlowRetime_Dfs_back((Abc_Obj_t *)pVVar17->pArray[lVar23],pVVar15);
          lVar23 = lVar23 + 1;
          pVVar17 = pNtk->vPos;
        } while (lVar23 < pVVar17->nSize);
        uVar25 = (ulong)(uint)pVVar15->nSize;
      }
      while (0 < (int)uVar25) {
        if (pVVar15->nSize < (int)uVar25) goto LAB_004e3fbe;
        uVar25 = uVar25 - 1;
        plVar6 = (long *)pVVar15->pArray[uVar25];
        uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
        *(uint *)((long)plVar6 + 0x14) = uVar14;
        if (0 < *(int *)((long)plVar6 + 0x2c)) {
          lVar23 = 0;
          uVar21 = uVar25;
          do {
            plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                               (long)*(int *)(plVar6[6] + lVar23 * 4) * 8);
            uVar14 = *(uint *)((long)plVar7 + 0x14);
            uVar19 = *(uint *)((long)plVar6 + 0x14);
            lVar24 = *plVar7;
            iVar4 = (int)plVar7[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar24 + 0xe0),iVar4 + 1,(int)uVar21);
            if (((long)iVar4 < 0) || (*(int *)(lVar24 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
            if (*(int *)(*(long *)(lVar24 + 0xe8) + (long)iVar4 * 4) == *(int *)(*plVar7 + 0xd8)) {
              uVar14 = (uint)((uVar19 & 0xf) == 7) + (uVar14 >> 0xc);
              if (*(uint *)((long)plVar6 + 0x14) >> 0xc < uVar14) {
                *(uint *)((long)plVar6 + 0x14) =
                     *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 * 0x1000;
              }
            }
            lVar23 = lVar23 + 1;
            uVar21 = extraout_RDX_09;
          } while (lVar23 < *(int *)((long)plVar6 + 0x2c));
          uVar14 = *(uint *)((long)plVar6 + 0x14);
        }
        if ((uVar14 & 0xf) == 5) {
          uVar14 = uVar14 | 0x10;
          *(uint *)((long)plVar6 + 0x14) = uVar14;
        }
        if (pManMR->maxDelay < (int)(uVar14 >> 0xc)) {
          __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0x11e,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
        }
      }
      pVVar15->nSize = 0;
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar4 = pNtk->vObjs->nSize;
        uVar21 = (long)iVar4 + 500;
        iVar22 = (int)uVar21;
        if ((pNtk->vTravIds).nCap < iVar22) {
          piVar16 = (int *)malloc(uVar21 * 4);
          (pNtk->vTravIds).pArray = piVar16;
          if (piVar16 == (int *)0x0) goto LAB_004e4170;
          (pNtk->vTravIds).nCap = iVar22;
          uVar25 = extraout_RDX_10;
        }
        else {
          piVar16 = (int *)0x0;
        }
        if (-500 < iVar4) {
          memset(piVar16,0,(uVar21 & 0xffffffff) << 2);
          uVar25 = extraout_RDX_11;
        }
        (pNtk->vTravIds).nSize = iVar22;
      }
      iVar4 = pNtk->nTravIds;
      pNtk->nTravIds = iVar4 + 1;
      if (iVar4 < 0x3fffffff) {
        pVVar17 = pNtk->vBoxes;
        if (0 < pVVar17->nSize) {
          lVar23 = 0;
          do {
            plVar6 = (long *)pVVar17->pArray[lVar23];
            if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 8) {
              lVar24 = *plVar6;
              lVar8 = *(long *)(*(long *)(lVar24 + 0x20) + 8);
              uVar25 = *(ulong *)(lVar8 + (long)*(int *)plVar6[6] * 8);
              pAVar9 = *(Abc_Obj_t **)(lVar8 + (long)*(int *)plVar6[4] * 8);
              iVar4 = (int)plVar6[2];
              uVar5 = *(undefined4 *)(lVar24 + 0xd8);
              Vec_IntFillExtra((Vec_Int_t *)(lVar24 + 0xe0),iVar4 + 1,(int)lVar8);
              if (((long)iVar4 < 0) || (*(int *)(lVar24 + 0xe4) <= iVar4)) goto LAB_004e403a;
              *(undefined4 *)(*(long *)(lVar24 + 0xe8) + (long)iVar4 * 4) = uVar5;
              Abc_FlowRetime_Dfs_back(pAVar9,pVVar15);
              uVar14 = *(uint *)(uVar25 + 0x14);
              if ((uVar14 & 0x10) == 0) {
                *(uint *)((long)plVar6 + 0x14) = *(uint *)((long)plVar6 + 0x14) & 0xfff;
              }
              else {
                *(uint *)(uVar25 + 0x14) = uVar14 & 0xffffffef;
                uVar19 = *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 & 0xfffff000;
                uVar25 = (ulong)uVar19;
                *(uint *)((long)plVar6 + 0x14) = uVar19;
                if (pManMR->maxDelay < (int)(uVar14 >> 0xc)) {
                  __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0x12f,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                }
              }
            }
            lVar23 = lVar23 + 1;
            pVVar17 = pNtk->vBoxes;
          } while (lVar23 < pVVar17->nSize);
          lVar23 = (long)pVVar15->nSize;
          if (0 < (long)pVVar15->nSize) {
            do {
              if (pVVar15->nSize < lVar23) goto LAB_004e3fbe;
              plVar6 = (long *)pVVar15->pArray[lVar23 + -1];
              *(uint *)((long)plVar6 + 0x14) = *(uint *)((long)plVar6 + 0x14) | 0x20;
              if (0 < *(int *)((long)plVar6 + 0x2c)) {
                lVar24 = 0;
                do {
                  plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                     (long)*(int *)(plVar6[6] + lVar24 * 4) * 8);
                  lVar8 = *plVar7;
                  iVar4 = (int)plVar7[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar4 + 1,(int)uVar25);
                  if (((long)iVar4 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
                  if ((*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar4 * 4) ==
                       *(int *)(*plVar7 + 0xd8)) &&
                     ((char)((*(uint *)((long)plVar7 + 0x14) & 0x20) >> 5) == '\0' &&
                      (*(uint *)((long)plVar7 + 0x14) & 0xf) != 8)) {
                    __assert_fail("pNext->fMarkB",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                  ,0x13b,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                  }
                  lVar24 = lVar24 + 1;
                  uVar25 = extraout_RDX_12;
                } while (lVar24 < *(int *)((long)plVar6 + 0x2c));
              }
              bVar12 = 1 < lVar23;
              lVar23 = lVar23 + -1;
            } while (bVar12);
            lVar23 = (long)pVVar15->nSize;
            if (0 < (long)pVVar15->nSize) {
              do {
                if (pVVar15->nSize < lVar23) goto LAB_004e3fbe;
                puVar1 = (uint *)((long)pVVar15->pArray[lVar23 + -1] + 0x14);
                *puVar1 = *puVar1 & 0xffffffdf;
                bVar12 = 1 < lVar23;
                lVar23 = lVar23 + -1;
              } while (bVar12);
              lVar23 = (long)pVVar15->nSize;
              if (0 < (long)pVVar15->nSize) {
                do {
                  if (pVVar15->nSize < lVar23) goto LAB_004e3fbe;
                  plVar6 = (long *)pVVar15->pArray[lVar23 + -1];
                  uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
                  *(uint *)((long)plVar6 + 0x14) = uVar14;
                  if (0 < *(int *)((long)plVar6 + 0x2c)) {
                    lVar24 = 0;
                    do {
                      plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                         (long)*(int *)(plVar6[6] + lVar24 * 4) * 8);
                      uVar14 = *(uint *)((long)plVar7 + 0x14);
                      uVar19 = *(uint *)((long)plVar6 + 0x14);
                      lVar8 = *plVar7;
                      iVar4 = (int)plVar7[2];
                      Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar4 + 1,(int)uVar25);
                      if (((long)iVar4 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
                      if (*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar4 * 4) ==
                          *(int *)(*plVar7 + 0xd8)) {
                        uVar14 = (uint)((uVar19 & 0xf) == 7) + (uVar14 >> 0xc);
                        if (*(uint *)((long)plVar6 + 0x14) >> 0xc < uVar14) {
                          *(uint *)((long)plVar6 + 0x14) =
                               *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 * 0x1000;
                        }
                      }
                      lVar24 = lVar24 + 1;
                      uVar25 = extraout_RDX_13;
                    } while (lVar24 < *(int *)((long)plVar6 + 0x2c));
                    uVar14 = *(uint *)((long)plVar6 + 0x14);
                  }
                  uVar14 = (uint)((uVar14 & 0xf) == 7) + (uVar14 >> 0xc);
                  uVar25 = (ulong)uVar14;
                  if (pManMR->maxDelay < (int)uVar14) {
                    *(ushort *)(pManMR->pDataArray + *(uint *)(plVar6 + 2)) =
                         *(ushort *)(pManMR->pDataArray + *(uint *)(plVar6 + 2)) | 0x10;
                  }
                  bVar12 = 1 < lVar23;
                  lVar23 = lVar23 + -1;
                } while (bVar12);
              }
            }
          }
        }
        pVVar17 = pNtk->vBoxes;
        if (0 < pVVar17->nSize) {
          lVar23 = 0;
          do {
            uVar14 = *(uint *)((long)pVVar17->pArray[lVar23] + 0x14);
            if ((uVar14 & 0xf) == 8) {
              *(uint *)((long)pVVar17->pArray[lVar23] + 0x14) = uVar14 & 0xff8;
              pVVar17 = pNtk->vBoxes;
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar17->nSize);
        }
        uVar25 = (ulong)(uint)pVVar15->nSize;
        while( true ) {
          if ((int)uVar25 < 1) {
            pVVar17 = pNtk->vBoxes;
            if (0 < pVVar17->nSize) {
              lVar23 = 0;
              do {
                plVar6 = (long *)pVVar17->pArray[lVar23];
                if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 8) {
                  lVar24 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
                  lVar8 = *(long *)(lVar24 + (long)*(int *)plVar6[6] * 8);
                  uVar14 = *(uint *)(lVar8 + 0x14);
                  if ((uVar14 & 0xf) != 5) {
                    __assert_fail("Abc_ObjIsBo(pBo)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                  ,0x16b,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                  }
                  if ((*(uint *)(*(long *)(lVar24 + (long)*(int *)plVar6[4] * 8) + 0x14) & 0xf) != 4
                     ) {
                    __assert_fail("Abc_ObjIsBi(pBi)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                  ,0x16d,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
                  }
                  if ((uVar14 & 0x10) == 0) {
                    uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xff8;
                  }
                  else {
                    *(uint *)(lVar8 + 0x14) = uVar14 & 0xffffffe5;
                    uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 & 0xfffff000;
                  }
                  *(uint *)((long)plVar6 + 0x14) = uVar14;
                  pVVar17 = pNtk->vBoxes;
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 < pVVar17->nSize);
            }
            lVar23 = (long)pVVar15->nSize;
            if ((long)pVVar15->nSize < 1) goto LAB_004e3f44;
            while (lVar23 <= pVVar15->nSize) {
              plVar6 = (long *)pVVar15->pArray[lVar23 + -1];
              uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
              *(uint *)((long)plVar6 + 0x14) = uVar14;
              if (0 < *(int *)((long)plVar6 + 0x2c)) {
                lVar24 = 0;
                do {
                  plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                     (long)*(int *)(plVar6[6] + lVar24 * 4) * 8);
                  uVar14 = *(uint *)((long)plVar7 + 0x14);
                  uVar19 = *(uint *)((long)plVar6 + 0x14);
                  lVar8 = *plVar7;
                  iVar4 = (int)plVar7[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar4 + 1,(int)plVar6);
                  if (((long)iVar4 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
                  if (*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar4 * 4) ==
                      *(int *)(*plVar7 + 0xd8)) {
                    uVar14 = (uint)((uVar19 & 0xf) == 7) + (uVar14 >> 0xc);
                    if (*(uint *)((long)plVar6 + 0x14) >> 0xc < uVar14) {
                      *(uint *)((long)plVar6 + 0x14) =
                           *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 * 0x1000;
                    }
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 < *(int *)((long)plVar6 + 0x2c));
                uVar14 = *(uint *)((long)plVar6 + 0x14);
              }
              pFVar2 = pManMR->pDataArray + *(uint *)(plVar6 + 2);
              if (pManMR->maxDelay < (int)(uVar14 >> 0xc)) {
                *(ushort *)pFVar2 = *(ushort *)pFVar2 | 0x80;
                pManMR->nConservConstraints = pManMR->nConservConstraints + 1;
              }
              else {
                *(ushort *)pFVar2 = *(ushort *)pFVar2 & 0xff7f;
              }
              bVar12 = lVar23 < 2;
              lVar23 = lVar23 + -1;
              if (bVar12) goto LAB_004e3f44;
            }
            break;
          }
          if (pVVar15->nSize < (int)uVar25) break;
          uVar25 = uVar25 - 1;
          plVar6 = (long *)pVVar15->pArray[uVar25];
          uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
          *(uint *)((long)plVar6 + 0x14) = uVar14;
          if (0 < *(int *)((long)plVar6 + 0x2c)) {
            lVar23 = 0;
            uVar21 = uVar25;
            do {
              plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                 (long)*(int *)(plVar6[6] + lVar23 * 4) * 8);
              uVar14 = *(uint *)((long)plVar7 + 0x14);
              uVar19 = *(uint *)((long)plVar6 + 0x14);
              lVar24 = *plVar7;
              iVar4 = (int)plVar7[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar24 + 0xe0),iVar4 + 1,(int)uVar21);
              if (((long)iVar4 < 0) || (*(int *)(lVar24 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
              if (*(int *)(*(long *)(lVar24 + 0xe8) + (long)iVar4 * 4) == *(int *)(*plVar7 + 0xd8))
              {
                uVar14 = (uint)((uVar19 & 0xf) == 7) + (uVar14 >> 0xc);
                if (*(uint *)((long)plVar6 + 0x14) >> 0xc < uVar14) {
                  *(uint *)((long)plVar6 + 0x14) =
                       *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 * 0x1000;
                }
              }
              lVar23 = lVar23 + 1;
              uVar21 = extraout_RDX_14;
            } while (lVar23 < *(int *)((long)plVar6 + 0x2c));
            uVar14 = *(uint *)((long)plVar6 + 0x14);
          }
          if ((uVar14 & 0xf) == 5) {
            uVar14 = uVar14 | 0x10;
            *(uint *)((long)plVar6 + 0x14) = uVar14;
          }
          if (pManMR->maxDelay < (int)(uVar14 >> 0xc)) {
            __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                          ,0x166,"void Abc_FlowRetime_ConstrainConserv_back(Abc_Ntk_t *)");
          }
        }
LAB_004e3fbe:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
  }
  else {
    if (pVVar15->nSize != 0) {
      __assert_fail("!Vec_PtrSize( vNodes )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                    ,0x7c,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
    }
    pMVar13->nConservConstraints = 0;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar4 = pNtk->vObjs->nSize;
      uVar25 = (long)iVar4 + 500;
      iVar22 = (int)uVar25;
      if ((pNtk->vTravIds).nCap < iVar22) {
        piVar16 = (int *)malloc(uVar25 * 4);
        (pNtk->vTravIds).pArray = piVar16;
        if (piVar16 == (int *)0x0) goto LAB_004e4170;
        (pNtk->vTravIds).nCap = iVar22;
        pAVar20 = extraout_RDX;
      }
      else {
        piVar16 = (int *)0x0;
      }
      if (-500 < iVar4) {
        memset(piVar16,0,(uVar25 & 0xffffffff) << 2);
        pAVar20 = extraout_RDX_00;
      }
      (pNtk->vTravIds).nSize = iVar22;
    }
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (iVar4 < 0x3fffffff) {
      pVVar17 = pNtk->vPis;
      if (pVVar17->nSize < 1) {
        uVar25 = 0;
      }
      else {
        lVar23 = 0;
        do {
          Abc_FlowRetime_Dfs_forw((Abc_Obj_t *)pVVar17->pArray[lVar23],pVVar15);
          lVar23 = lVar23 + 1;
          pVVar17 = pNtk->vPis;
        } while (lVar23 < pVVar17->nSize);
        uVar25 = (ulong)(uint)pVVar15->nSize;
        pAVar20 = extraout_RDX_01;
      }
      while (0 < (int)uVar25) {
        if (pVVar15->nSize < (int)uVar25) goto LAB_004e3fbe;
        uVar25 = uVar25 - 1;
        plVar6 = (long *)pVVar15->pArray[uVar25];
        uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
        *(uint *)((long)plVar6 + 0x14) = uVar14;
        if (0 < *(int *)((long)plVar6 + 0x1c)) {
          lVar23 = 0;
          do {
            plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                               (long)*(int *)(plVar6[4] + lVar23 * 4) * 8);
            lVar24 = *plVar7;
            iVar4 = (int)plVar7[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar24 + 0xe0),iVar4 + 1,(int)pAVar20);
            if (((long)iVar4 < 0) || (*(int *)(lVar24 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
            pAVar20 = extraout_RDX_02;
            if (*(int *)(*(long *)(lVar24 + 0xe8) + (long)iVar4 * 4) == *(int *)(*plVar7 + 0xd8)) {
              uVar14 = *(uint *)((long)plVar6 + 0x14) >> 0xc;
              pAVar20 = (Abc_Ntk_t *)(ulong)uVar14;
              if (uVar14 < *(uint *)((long)plVar7 + 0x14) >> 0xc) {
                *(uint *)((long)plVar6 + 0x14) =
                     *(uint *)((long)plVar6 + 0x14) & 0xfff |
                     *(uint *)((long)plVar7 + 0x14) & 0xfffff000;
              }
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < *(int *)((long)plVar6 + 0x1c));
          uVar14 = *(uint *)((long)plVar6 + 0x14);
        }
        uVar18 = (uint)((uVar14 & 0xf) == 7) * 0x1000 + uVar14;
        pAVar20 = (Abc_Ntk_t *)(ulong)uVar18;
        uVar19 = uVar18 | 0x10;
        if ((uVar14 & 0xf) != 4) {
          uVar19 = uVar18;
        }
        *(uint *)((long)plVar6 + 0x14) = uVar19;
        if (pManMR->maxDelay < (int)(uVar19 >> 0xc)) {
          __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                        ,0x94,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
        }
      }
      pVVar15->nSize = 0;
      if ((pNtk->vTravIds).pArray == (int *)0x0) {
        iVar4 = pNtk->vObjs->nSize;
        uVar25 = (long)iVar4 + 500;
        iVar22 = (int)uVar25;
        if ((pNtk->vTravIds).nCap < iVar22) {
          piVar16 = (int *)malloc(uVar25 * 4);
          (pNtk->vTravIds).pArray = piVar16;
          if (piVar16 == (int *)0x0) {
LAB_004e4170:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pNtk->vTravIds).nCap = iVar22;
          pAVar20 = extraout_RDX_03;
        }
        else {
          piVar16 = (int *)0x0;
        }
        if (-500 < iVar4) {
          memset(piVar16,0,(uVar25 & 0xffffffff) << 2);
          pAVar20 = extraout_RDX_04;
        }
        (pNtk->vTravIds).nSize = iVar22;
      }
      iVar4 = pNtk->nTravIds;
      pNtk->nTravIds = iVar4 + 1;
      if (iVar4 < 0x3fffffff) {
        pVVar17 = pNtk->vBoxes;
        if (0 < pVVar17->nSize) {
          lVar23 = 0;
          do {
            plVar6 = (long *)pVVar17->pArray[lVar23];
            if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 8) {
              lVar24 = *plVar6;
              lVar8 = *(long *)(*(long *)(lVar24 + 0x20) + 8);
              pAVar9 = *(Abc_Obj_t **)(lVar8 + (long)*(int *)plVar6[6] * 8);
              lVar10 = *(long *)(lVar8 + (long)*(int *)plVar6[4] * 8);
              iVar4 = (int)plVar6[2];
              uVar5 = *(undefined4 *)(lVar24 + 0xd8);
              Vec_IntFillExtra((Vec_Int_t *)(lVar24 + 0xe0),iVar4 + 1,(int)lVar8);
              if (((long)iVar4 < 0) || (*(int *)(lVar24 + 0xe4) <= iVar4)) {
LAB_004e403a:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(undefined4 *)(*(long *)(lVar24 + 0xe8) + (long)iVar4 * 4) = uVar5;
              Abc_FlowRetime_Dfs_forw(pAVar9,pVVar15);
              uVar14 = *(uint *)(lVar10 + 0x14);
              if ((uVar14 & 0x10) == 0) {
                *(uint *)((long)plVar6 + 0x14) = *(uint *)((long)plVar6 + 0x14) & 0xfff;
              }
              else {
                *(uint *)(lVar10 + 0x14) = uVar14 & 0xffffffef;
                *(uint *)((long)plVar6 + 0x14) =
                     *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 & 0xfffff000;
                if (pManMR->maxDelay < (int)(uVar14 >> 0xc)) {
                  __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0xa5,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
                }
              }
            }
            lVar23 = lVar23 + 1;
            pVVar17 = pNtk->vBoxes;
          } while (lVar23 < pVVar17->nSize);
          pAVar20 = pNtk;
          lVar23 = (long)pVVar15->nSize;
          if (0 < (long)pVVar15->nSize) {
            do {
              if (pVVar15->nSize < lVar23) goto LAB_004e3fbe;
              plVar6 = (long *)pVVar15->pArray[lVar23 + -1];
              *(uint *)((long)plVar6 + 0x14) = *(uint *)((long)plVar6 + 0x14) | 0x20;
              if (0 < *(int *)((long)plVar6 + 0x1c)) {
                lVar24 = 0;
                do {
                  plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                     (long)*(int *)(plVar6[4] + lVar24 * 4) * 8);
                  lVar8 = *plVar7;
                  iVar4 = (int)plVar7[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar4 + 1,(int)pAVar20);
                  if (((long)iVar4 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
                  if ((*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar4 * 4) ==
                       *(int *)(*plVar7 + 0xd8)) &&
                     ((char)((*(uint *)((long)plVar7 + 0x14) & 0x20) >> 5) == '\0' &&
                      (*(uint *)((long)plVar7 + 0x14) & 0xf) != 8)) {
                    __assert_fail("pNext->fMarkB",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                  ,0xb1,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
                  }
                  lVar24 = lVar24 + 1;
                  pAVar20 = extraout_RDX_05;
                } while (lVar24 < *(int *)((long)plVar6 + 0x1c));
              }
              bVar12 = 1 < lVar23;
              lVar23 = lVar23 + -1;
            } while (bVar12);
            lVar23 = (long)pVVar15->nSize;
            if (0 < (long)pVVar15->nSize) {
              do {
                if (pVVar15->nSize < lVar23) goto LAB_004e3fbe;
                puVar1 = (uint *)((long)pVVar15->pArray[lVar23 + -1] + 0x14);
                *puVar1 = *puVar1 & 0xffffffdf;
                bVar12 = 1 < lVar23;
                lVar23 = lVar23 + -1;
              } while (bVar12);
              lVar23 = (long)pVVar15->nSize;
              if (0 < (long)pVVar15->nSize) {
                do {
                  if (pVVar15->nSize < lVar23) goto LAB_004e3fbe;
                  plVar6 = (long *)pVVar15->pArray[lVar23 + -1];
                  uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
                  *(uint *)((long)plVar6 + 0x14) = uVar14;
                  if (0 < *(int *)((long)plVar6 + 0x1c)) {
                    lVar24 = 0;
                    do {
                      plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                         (long)*(int *)(plVar6[4] + lVar24 * 4) * 8);
                      lVar8 = *plVar7;
                      iVar4 = (int)plVar7[2];
                      Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar4 + 1,(int)pAVar20);
                      if (((long)iVar4 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
                      pAVar20 = extraout_RDX_06;
                      if (*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar4 * 4) ==
                          *(int *)(*plVar7 + 0xd8)) {
                        uVar14 = *(uint *)((long)plVar6 + 0x14) >> 0xc;
                        pAVar20 = (Abc_Ntk_t *)(ulong)uVar14;
                        if (uVar14 < *(uint *)((long)plVar7 + 0x14) >> 0xc) {
                          *(uint *)((long)plVar6 + 0x14) =
                               *(uint *)((long)plVar6 + 0x14) & 0xfff |
                               *(uint *)((long)plVar7 + 0x14) & 0xfffff000;
                        }
                      }
                      lVar24 = lVar24 + 1;
                    } while (lVar24 < *(int *)((long)plVar6 + 0x1c));
                    uVar14 = *(uint *)((long)plVar6 + 0x14);
                  }
                  uVar14 = (uint)((uVar14 & 0xf) == 7) * 0x1000 + uVar14;
                  *(uint *)((long)plVar6 + 0x14) = uVar14;
                  uVar14 = uVar14 >> 0xc;
                  pAVar20 = (Abc_Ntk_t *)(ulong)uVar14;
                  if (pManMR->maxDelay < (int)uVar14) {
                    *(ushort *)(pManMR->pDataArray + *(uint *)(plVar6 + 2)) =
                         *(ushort *)(pManMR->pDataArray + *(uint *)(plVar6 + 2)) | 0x10;
                  }
                  bVar12 = 1 < lVar23;
                  lVar23 = lVar23 + -1;
                } while (bVar12);
              }
            }
          }
        }
        pVVar17 = pNtk->vBoxes;
        if (0 < pVVar17->nSize) {
          lVar23 = 0;
          do {
            uVar14 = *(uint *)((long)pVVar17->pArray[lVar23] + 0x14);
            if ((uVar14 & 0xf) == 8) {
              *(uint *)((long)pVVar17->pArray[lVar23] + 0x14) = uVar14 & 0xff8;
              pVVar17 = pNtk->vBoxes;
            }
            lVar23 = lVar23 + 1;
            pAVar20 = (Abc_Ntk_t *)(long)pVVar17->nSize;
          } while (lVar23 < (long)pAVar20);
        }
        uVar25 = (ulong)(uint)pVVar15->nSize;
        do {
          if ((int)uVar25 < 1) {
            pVVar17 = pNtk->vBoxes;
            if (0 < pVVar17->nSize) {
              lVar23 = 0;
              do {
                plVar6 = (long *)pVVar17->pArray[lVar23];
                if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 8) {
                  lVar24 = *(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                    (long)*(int *)plVar6[4] * 8);
                  uVar14 = *(uint *)(lVar24 + 0x14);
                  if ((uVar14 & 0x10) == 0) {
                    *(uint *)((long)plVar6 + 0x14) = *(uint *)((long)plVar6 + 0x14) & 0xff8;
                  }
                  else {
                    *(uint *)(lVar24 + 0x14) = uVar14 & 0xffffffef;
                    *(uint *)((long)plVar6 + 0x14) =
                         *(uint *)((long)plVar6 + 0x14) & 0xfff | uVar14 & 0xfffff000;
                    if (pManMR->maxDelay < (int)(uVar14 >> 0xc)) {
                      __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                    ,0xe5,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
                    }
                  }
                }
                lVar23 = lVar23 + 1;
                pVVar17 = pNtk->vBoxes;
              } while (lVar23 < pVVar17->nSize);
            }
            lVar23 = (long)pVVar15->nSize;
            if (0 < (long)pVVar15->nSize) {
              do {
                if (pVVar15->nSize < lVar23) goto LAB_004e3fbe;
                plVar6 = (long *)pVVar15->pArray[lVar23 + -1];
                uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
                *(uint *)((long)plVar6 + 0x14) = uVar14;
                if (0 < *(int *)((long)plVar6 + 0x1c)) {
                  lVar24 = 0;
                  do {
                    plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                       (long)*(int *)(plVar6[4] + lVar24 * 4) * 8);
                    lVar8 = *plVar7;
                    iVar4 = (int)plVar7[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar4 + 1,(int)pVVar17);
                    if (((long)iVar4 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar4)) goto LAB_004e3f9f;
                    pVVar17 = extraout_RDX_08;
                    if (*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar4 * 4) ==
                        *(int *)(*plVar7 + 0xd8)) {
                      uVar14 = *(uint *)((long)plVar6 + 0x14) >> 0xc;
                      pVVar17 = (Vec_Ptr_t *)(ulong)uVar14;
                      if (uVar14 < *(uint *)((long)plVar7 + 0x14) >> 0xc) {
                        *(uint *)((long)plVar6 + 0x14) =
                             *(uint *)((long)plVar6 + 0x14) & 0xfff |
                             *(uint *)((long)plVar7 + 0x14) & 0xfffff000;
                      }
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < *(int *)((long)plVar6 + 0x1c));
                  uVar14 = *(uint *)((long)plVar6 + 0x14);
                }
                uVar14 = (uint)((uVar14 & 0xf) == 7) * 0x1000 + uVar14;
                *(uint *)((long)plVar6 + 0x14) = uVar14;
                uVar14 = uVar14 >> 0xc;
                pVVar17 = (Vec_Ptr_t *)(ulong)uVar14;
                pFVar2 = pManMR->pDataArray + *(uint *)(plVar6 + 2);
                if (pManMR->maxDelay < (int)uVar14) {
                  *(ushort *)pFVar2 = *(ushort *)pFVar2 | 0x80;
                  pManMR->nConservConstraints = pManMR->nConservConstraints + 1;
                }
                else {
                  *(ushort *)pFVar2 = *(ushort *)pFVar2 & 0xff7f;
                }
                bVar12 = 1 < lVar23;
                lVar23 = lVar23 + -1;
              } while (bVar12);
            }
LAB_004e3f44:
            pVVar15->nSize = 0;
            lVar23 = (long)pNtk->vObjs->nSize;
            if (0 < lVar23) {
              lVar24 = 0;
              do {
                pvVar11 = pNtk->vObjs->pArray[lVar24];
                if ((pvVar11 != (void *)0x0) &&
                   (pManMR->vTimeEdges[*(uint *)((long)pvVar11 + 0x10)].nSize != 0)) {
                  __assert_fail("!Vec_PtrSize(FTIMEEDGES(pObj))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                                ,0x73,"void Abc_FlowRetime_ConstrainConserv(Abc_Ntk_t *)");
                }
                lVar24 = lVar24 + 1;
              } while (lVar23 != lVar24);
            }
            return;
          }
          if (pVVar15->nSize < (int)uVar25) goto LAB_004e3fbe;
          uVar25 = uVar25 - 1;
          plVar6 = (long *)pVVar15->pArray[uVar25];
          uVar14 = *(uint *)((long)plVar6 + 0x14) & 0xfff;
          *(uint *)((long)plVar6 + 0x14) = uVar14;
          if (0 < *(int *)((long)plVar6 + 0x1c)) {
            lVar23 = 0;
            do {
              plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                 (long)*(int *)(plVar6[4] + lVar23 * 4) * 8);
              lVar24 = *plVar7;
              iVar4 = (int)plVar7[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar24 + 0xe0),iVar4 + 1,(int)pAVar20);
              if (((long)iVar4 < 0) || (*(int *)(lVar24 + 0xe4) <= iVar4)) {
LAB_004e3f9f:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pAVar20 = extraout_RDX_07;
              if (*(int *)(*(long *)(lVar24 + 0xe8) + (long)iVar4 * 4) == *(int *)(*plVar7 + 0xd8))
              {
                uVar14 = *(uint *)((long)plVar6 + 0x14) >> 0xc;
                pAVar20 = (Abc_Ntk_t *)(ulong)uVar14;
                if (uVar14 < *(uint *)((long)plVar7 + 0x14) >> 0xc) {
                  *(uint *)((long)plVar6 + 0x14) =
                       *(uint *)((long)plVar6 + 0x14) & 0xfff |
                       *(uint *)((long)plVar7 + 0x14) & 0xfffff000;
                }
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 < *(int *)((long)plVar6 + 0x1c));
            uVar14 = *(uint *)((long)plVar6 + 0x14);
          }
          uVar18 = (uint)((uVar14 & 0xf) == 7) * 0x1000 + uVar14;
          pAVar20 = (Abc_Ntk_t *)(ulong)uVar18;
          uVar19 = uVar18 | 0x10;
          if ((uVar14 & 0xf) != 4) {
            uVar19 = uVar18;
          }
          *(uint *)((long)plVar6 + 0x14) = uVar19;
          if (pManMR->maxDelay < (int)(uVar19 >> 0xc)) {
            __assert_fail("(int)pObj->Level <= pManMR->maxDelay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretTime.c"
                          ,0xdb,"void Abc_FlowRetime_ConstrainConserv_forw(Abc_Ntk_t *)");
          }
        } while( true );
      }
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_FlowRetime_ConstrainConserv( Abc_Ntk_t * pNtk ) {  
  Abc_Obj_t *pObj;
  int i;
  void *pArray;

  // clear all exact constraints
  pManMR->nExactConstraints = 0;
  while( Vec_PtrSize( pManMR->vExactNodes )) {
    pObj = (Abc_Obj_t*)Vec_PtrPop( pManMR->vExactNodes );
    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainConserv_forw(pNtk);
  } else {
    Abc_FlowRetime_ConstrainConserv_back(pNtk);
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i)
    assert( !Vec_PtrSize(FTIMEEDGES(pObj)) );
}